

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapElements
          (Reflection *this,Message *message,FieldDescriptor *field,int index1,int index2)

{
  void *pvVar1;
  bool bVar2;
  CppType CVar3;
  uint32 uVar4;
  RepeatedPtrFieldBase *pRVar5;
  Rep *pRVar6;
  MapFieldBase *this_00;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x42] != (FieldDescriptor)0x1) {
    CVar3 = FieldDescriptor::cpp_type(field);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<int>::SwapElements
                ((RepeatedField<int> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),index1,
                 index2);
      return;
    case CPPTYPE_INT64:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<long>::SwapElements
                ((RepeatedField<long> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),index1,
                 index2);
      return;
    case CPPTYPE_UINT32:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_int>::SwapElements
                ((RepeatedField<unsigned_int> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),index1,
                 index2);
      return;
    case CPPTYPE_UINT64:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_long>::SwapElements
                ((RepeatedField<unsigned_long> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),index1,
                 index2);
      return;
    case CPPTYPE_DOUBLE:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<double>::SwapElements
                ((RepeatedField<double> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),index1,
                 index2);
      return;
    case CPPTYPE_FLOAT:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<float>::SwapElements
                ((RepeatedField<float> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),index1,
                 index2);
      return;
    case CPPTYPE_BOOL:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<bool>::SwapElements
                ((RepeatedField<bool> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),index1,
                 index2);
      return;
    case CPPTYPE_STRING:
    case CPPTYPE_MESSAGE:
      bVar2 = FieldDescriptor::is_map(field);
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      this_00 = (MapFieldBase *)
                ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
      if (bVar2) {
        pRVar5 = internal::MapFieldBase::MutableRepeatedField(this_00);
        pRVar6 = pRVar5->rep_;
      }
      else {
        pRVar6 = (Rep *)this_00->repeated_field_;
      }
      pvVar1 = pRVar6->elements[index1];
      pRVar6->elements[index1] = pRVar6->elements[index2];
      pRVar6->elements[index2] = pvVar1;
    }
    return;
  }
  internal::ExtensionSet::SwapElements
            ((ExtensionSet *)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),index1,index2);
  return;
}

Assistant:

void Reflection::SwapElements(Message* message, const FieldDescriptor* field,
                              int index1, int index2) const {
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                 \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:              \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field) \
        ->SwapElements(index1, index2);                   \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->SwapElements(index1, index2);
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->SwapElements(index1, index2);
        }
        break;
    }
  }
}